

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

CURLcode glob_url(URLGlob **glob,char *url,unsigned_long *urlnum,FILE *error)

{
  URLPattern *pUVar1;
  anon_union_40_3_e2f18bb4_for_content *paVar2;
  byte bVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  size_t sVar12;
  char *pcVar13;
  URLGlob *glob_00;
  long lVar14;
  char **ppcVar15;
  char *__dest;
  byte *pbVar16;
  int *piVar17;
  ulong uVar18;
  ulong uVar19;
  unsigned_long uVar20;
  ulong uVar21;
  ulong uVar22;
  byte *pbVar23;
  uint uVar24;
  byte *pbVar25;
  byte *pbVar26;
  byte *__s;
  anon_union_40_3_e2f18bb4_for_content *paVar27;
  byte *pbVar28;
  bool bVar29;
  CURLcode local_284;
  byte *local_278;
  char end_c;
  char max_c;
  char min_c;
  unsigned_long local_268;
  int local_25c;
  FILE *local_258;
  unsigned_long *local_250;
  byte *local_248;
  URLGlob **local_240;
  char hostname [128];
  
  *glob = (URLGlob *)0x0;
  local_258 = error;
  local_250 = urlnum;
  local_248 = (byte *)url;
  local_240 = glob;
  sVar12 = strlen(url);
  pcVar13 = (char *)malloc(sVar12 + 1);
  if (pcVar13 != (char *)0x0) {
    *pcVar13 = '\0';
    local_268 = 1;
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 != (URLGlob *)0x0) {
      glob_00->urllen = sVar12;
      glob_00->glob_buffer = pcVar13;
      local_278 = (byte *)0x1;
      local_284 = CURLE_OK;
      local_25c = 0;
      __s = local_248;
LAB_0011ba41:
      if ((*__s != 0) && (local_284 == CURLE_OK)) {
        pbVar25 = (byte *)glob_00->glob_buffer;
        sVar12 = 0;
        while( true ) {
          for (; bVar3 = *__s, bVar3 == 0x5b; __s = __s + (long)pcVar13) {
            pcVar13 = strchr((char *)__s,0x5d);
            if (((pcVar13 == (char *)0x0) ||
                (pcVar13 = pcVar13 + (1 - (long)__s), (char *)0x7f < pcVar13)) ||
               (lVar14 = curl_url(), lVar14 == 0)) {
              pcVar13 = (char *)0x0;
              bVar29 = false;
            }
            else {
              memcpy(hostname,__s,(size_t)pcVar13);
              hostname[(long)pcVar13] = '\0';
              iVar11 = curl_url_set(lVar14,0,hostname,0x200);
              curl_url_cleanup(lVar14);
              bVar29 = iVar11 == 0;
              if (!bVar29) {
                pcVar13 = (char *)0x0;
              }
            }
            if ((!bVar29) && (__s[1] == 0x5d)) {
              pcVar13 = (char *)0x2;
            }
            if (pcVar13 == (char *)0x0) goto LAB_0011bb90;
            memcpy(pbVar25,__s,(size_t)pcVar13);
            pbVar25 = pbVar25 + (long)pcVar13;
            sVar12 = sVar12 + (long)pcVar13;
          }
          if (0x5c < bVar3) break;
          if (bVar3 == 0) goto LAB_0011bb90;
          if (((bVar3 == 0x5c) && (__s[1] - 0x5b < 0x23)) &&
             ((0x500000005U >> ((ulong)(__s[1] - 0x5b) & 0x3f) & 1) != 0)) {
            __s = __s + 1;
            local_278 = local_278 + 1;
          }
LAB_0011bb73:
          bVar3 = *__s;
          __s = __s + 1;
          *pbVar25 = bVar3;
          pbVar25 = pbVar25 + 1;
          local_278 = local_278 + 1;
          sVar12 = sVar12 + 1;
        }
        if (bVar3 == 0x5d) {
LAB_0011bc33:
          pcVar13 = "unmatched close brace/bracket";
          goto LAB_0011c2c1;
        }
        if (bVar3 != 0x7b) {
          if (bVar3 != 0x7d) goto LAB_0011bb73;
          goto LAB_0011bc33;
        }
LAB_0011bb90:
        pbVar23 = __s;
        pbVar28 = local_278;
        if (sVar12 == 0) {
          if (*__s != 0x5b) {
            if (*__s == 0x7b) {
              pbVar23 = __s + 1;
              sVar4 = glob_00->size;
              pbVar25 = (byte *)glob_00->glob_buffer;
              glob_00->pattern[sVar4].type = UPTSet;
              paVar27 = &glob_00->pattern[sVar4].content;
              paVar2 = &glob_00->pattern[sVar4].content;
              (paVar2->Set).elements = (char **)0x0;
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->min_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->max_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->ptr_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->field_0x3 = 0;
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->step = 0;
              glob_00->pattern[sVar4].globindex = local_25c;
              local_25c = local_25c + 1;
              pbVar16 = local_278;
              pbVar26 = pbVar23;
LAB_0011bcbc:
              pbVar28 = pbVar16 + 1;
              bVar3 = *pbVar26;
              if (bVar3 < 0x5c) {
                uVar20 = local_268;
                if (bVar3 != 0x2c) {
                  if (bVar3 != 0) {
                    if (bVar3 != 0x5b) goto LAB_0011be0b;
LAB_0011c061:
                    pcVar13 = "nested brace";
                    goto LAB_0011c18f;
                  }
                  glob_00->error = "unmatched brace";
                  glob_00->pos = (size_t)local_278;
                  goto LAB_0011c294;
                }
LAB_0011bd45:
                local_268 = uVar20;
                *pbVar25 = 0;
                if ((paVar27->Set).elements == (char **)0x0) {
                  ppcVar15 = (char **)malloc(8);
                  (paVar27->Set).elements = ppcVar15;
                }
                else {
                  ppcVar15 = (char **)realloc((paVar27->Set).elements,
                                              (long)glob_00->pattern[sVar4].content.Set.size * 8 + 8
                                             );
                  if (ppcVar15 == (char **)0x0) {
                    glob_00->error = "out of memory";
                    glob_00->pos = 0;
                    local_284 = CURLE_OUT_OF_MEMORY;
                    goto LAB_0011c29c;
                  }
                  (paVar27->Set).elements = ppcVar15;
                }
                ppcVar15 = (paVar27->Set).elements;
                if (ppcVar15 == (char **)0x0) {
LAB_0011c034:
                  glob_00->error = "out of memory";
                  glob_00->pos = 0;
                  local_284 = CURLE_OUT_OF_MEMORY;
                  goto LAB_0011c29c;
                }
                pcVar13 = strdup(glob_00->glob_buffer);
                ppcVar15[glob_00->pattern[sVar4].content.Set.size] = pcVar13;
                iVar11 = glob_00->pattern[sVar4].content.Set.size;
                if (glob_00->pattern[sVar4].content.Set.elements[iVar11] == (char *)0x0)
                goto LAB_0011c034;
                glob_00->pattern[sVar4].content.Set.size = iVar11 + 1;
                if (*pbVar26 == 0x7d) {
                  pbVar23 = pbVar26 + 1;
                  local_284 = CURLE_OK;
                  goto LAB_0011c29c;
                }
                pbVar25 = (byte *)glob_00->glob_buffer;
                pbVar16 = pbVar28;
              }
              else {
                if (bVar3 < 0x7b) {
                  if (bVar3 == 0x5c) {
                    if (pbVar26[1] != 0) {
                      pbVar26 = pbVar26 + 1;
                      pbVar28 = pbVar16 + 2;
                    }
                  }
                  else if (bVar3 == 0x5d) goto LAB_0011c175;
                }
                else {
                  if (bVar3 == 0x7d) {
                    if (pbVar23 == pbVar26) {
                      pcVar13 = "empty string within braces";
                      goto LAB_0011c18f;
                    }
                    iVar11 = glob_00->pattern[sVar4].content.Set.size + 1;
                    if (iVar11 != 0) {
                      auVar5._8_8_ = 0;
                      auVar5._0_8_ = (long)iVar11;
                      auVar8._8_8_ = 0;
                      auVar8._0_8_ = local_268;
                      uVar20 = SUB168(auVar5 * auVar8,0);
                      if (SUB168(auVar5 * auVar8,8) == 0) goto LAB_0011bd45;
                      glob_00->error = "range overflow";
                      glob_00->pos = 0;
                      goto LAB_0011c294;
                    }
                    local_268 = 0;
                    uVar20 = local_268;
                    goto LAB_0011bd45;
                  }
                  if (bVar3 == 0x7b) goto LAB_0011c061;
                }
LAB_0011be0b:
                *pbVar25 = *pbVar26;
                pbVar25 = pbVar25 + 1;
                pbVar16 = pbVar28;
              }
              pbVar26 = pbVar26 + 1;
              goto LAB_0011bcbc;
            }
            goto LAB_0011c29c;
          }
          pbVar25 = __s + 1;
          pbVar28 = local_278 + 1;
          pUVar1 = glob_00->pattern + glob_00->size;
          glob_00->pattern[glob_00->size].globindex = local_25c;
          local_25c = local_25c + 1;
          iVar11 = Curl_isalpha((uint)__s[1]);
          pbVar23 = pbVar25;
          if (iVar11 == 0) {
            iVar11 = Curl_isdigit((uint)*pbVar25);
            if (iVar11 == 0) {
              glob_00->error = "bad range specification";
            }
            else {
              pUVar1->type = UPTNumRange;
              (pUVar1->content).NumRange.padlength = 0;
              if ((*pbVar25 == 0x30) && (iVar11 = Curl_isdigit(0x30), iVar11 != 0)) {
                pbVar23 = __s + 2;
                do {
                  piVar17 = &(pUVar1->content).NumRange.padlength;
                  *piVar17 = *piVar17 + 1;
                  iVar11 = Curl_isdigit((uint)*pbVar23);
                  pbVar23 = pbVar23 + 1;
                } while (iVar11 != 0);
              }
              piVar17 = __errno_location();
              *piVar17 = 0;
              uVar22 = strtoul((char *)pbVar25,(char **)hostname,10);
              if (((*piVar17 == 0) && ((byte *)hostname._0_8_ != pbVar25)) &&
                 (pbVar23 = (byte *)hostname._0_8_, *(char *)hostname._0_8_ == '-')) {
                do {
                  do {
                    pbVar23 = pbVar23 + 1;
                    bVar3 = *pbVar23;
                  } while (bVar3 == 0x20);
                } while (bVar3 == 9);
                iVar11 = Curl_isdigit((uint)bVar3);
                if (iVar11 == 0) {
                  hostname[0] = '\0';
                  hostname[1] = '\0';
                  hostname[2] = '\0';
                  hostname[3] = '\0';
                  hostname[4] = '\0';
                  hostname[5] = '\0';
                  hostname[6] = '\0';
                  hostname[7] = '\0';
                  uVar18 = 0;
                  uVar21 = 0;
                }
                else {
                  *piVar17 = 0;
                  uVar18 = strtoul((char *)pbVar23,(char **)hostname,10);
                  if (*piVar17 == 0) {
                    uVar21 = 1;
                    if (*(char *)hostname._0_8_ == ':') {
                      pbVar23 = (byte *)(hostname._0_8_ + 1);
                      *piVar17 = 0;
                      uVar21 = strtoul((char *)pbVar23,(char **)hostname,10);
                      if (*piVar17 != 0) {
                        hostname[0] = '\0';
                        hostname[1] = '\0';
                        hostname[2] = '\0';
                        hostname[3] = '\0';
                        hostname[4] = '\0';
                        hostname[5] = '\0';
                        hostname[6] = '\0';
                        hostname[7] = '\0';
                      }
                    }
                  }
                  else {
                    hostname[0] = '\0';
                    hostname[1] = '\0';
                    hostname[2] = '\0';
                    hostname[3] = '\0';
                    hostname[4] = '\0';
                    hostname[5] = '\0';
                    hostname[6] = '\0';
                    hostname[7] = '\0';
                    uVar21 = 0;
                  }
                  if ((hostname._0_8_ == 0) || (*(char *)hostname._0_8_ != ']')) {
                    hostname[0] = '\0';
                    hostname[1] = '\0';
                    hostname[2] = '\0';
                    hostname[3] = '\0';
                    hostname[4] = '\0';
                    hostname[5] = '\0';
                    hostname[6] = '\0';
                    hostname[7] = '\0';
                  }
                  else {
                    pbVar23 = (byte *)(hostname._0_8_ + 1);
                  }
                }
              }
              else {
                hostname[0] = '\0';
                hostname[1] = '\0';
                hostname[2] = '\0';
                hostname[3] = '\0';
                hostname[4] = '\0';
                hostname[5] = '\0';
                hostname[6] = '\0';
                hostname[7] = '\0';
                uVar18 = 0;
                uVar21 = 0;
                pbVar23 = pbVar25;
              }
              pbVar28 = pbVar23 + ((long)pbVar28 - (long)pbVar25);
              pcVar13 = "bad range";
              if (((hostname._0_8_ != 0) && (pcVar13 = "bad range", uVar21 != 0)) &&
                 ((uVar18 != uVar22 || (pcVar13 = "bad range", uVar21 == 1)))) {
                uVar19 = uVar18 - uVar22;
                if ((uVar19 == 0) ||
                   ((pcVar13 = "bad range", uVar22 <= uVar18 &&
                    (pcVar13 = "bad range", uVar21 <= uVar19)))) {
                  (pUVar1->content).NumRange.min_n = uVar22;
                  (pUVar1->content).NumRange.ptr_n = uVar22;
                  (pUVar1->content).NumRange.max_n = uVar18;
                  (pUVar1->content).NumRange.step = uVar21;
                  uVar20 = 0;
                  uVar22 = uVar19 / uVar21 + 1;
                  if (uVar22 != 0) {
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = uVar22;
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = local_268;
                    uVar20 = SUB168(auVar6 * auVar9,0);
                    pcVar13 = "range overflow";
                    if (SUB168(auVar6 * auVar9,8) != 0) goto LAB_0011c01a;
                  }
                  local_284 = CURLE_OK;
                  local_268 = uVar20;
                  goto LAB_0011c29c;
                }
              }
LAB_0011c01a:
              glob_00->error = pcVar13;
            }
          }
          else {
            pUVar1->type = UPTCharRange;
            iVar11 = __isoc99_sscanf(pbVar25,"%c-%c%c",&min_c,&max_c,&end_c);
            uVar22 = 1;
            bVar29 = true;
            if (iVar11 == 3) {
              if (end_c == ']') {
                bVar29 = false;
                pbVar23 = __s + 5;
              }
              else if (end_c == ':') {
                piVar17 = __errno_location();
                *piVar17 = 0;
                uVar22 = strtoul((char *)(__s + 5),(char **)hostname,10);
                if ((*piVar17 == 0) && (__s + 5 != (byte *)hostname._0_8_)) {
                  pbVar23 = (byte *)(hostname._0_8_ + 1);
                  if (*(char *)hostname._0_8_ != ']') {
                    uVar22 = 0;
                    pbVar23 = pbVar25;
                  }
                }
                else {
                  uVar22 = 0;
                }
                bVar29 = false;
              }
            }
            pbVar28 = pbVar23 + ((long)pbVar28 - (long)pbVar25);
            pcVar13 = "bad range";
            if (((!bVar29) && (pcVar13 = "bad range", 0xffffffff80000000 < uVar22 - 0x80000000)) &&
               ((min_c != max_c || (pcVar13 = "bad range", uVar22 == 1)))) {
              if (min_c == max_c) {
LAB_0011c2f9:
                (pUVar1->content).CharRange.step = (int)uVar22;
                (pUVar1->content).CharRange.min_c = min_c;
                (pUVar1->content).CharRange.ptr_c = min_c;
                (pUVar1->content).CharRange.max_c = max_c;
                iVar11 = ((int)max_c - (int)min_c) / (int)uVar22 + 1;
                if (iVar11 == 0) {
                  local_268 = 0;
                  uVar20 = local_268;
                }
                else {
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = (long)iVar11;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = local_268;
                  pcVar13 = "range overflow";
                  uVar20 = SUB168(auVar7 * auVar10,0);
                  if (SUB168(auVar7 * auVar10,8) != 0) goto LAB_0011c27f;
                }
                local_268 = uVar20;
                local_284 = CURLE_OK;
                goto LAB_0011c29c;
              }
              pcVar13 = "bad range";
              if (min_c <= max_c) {
                uVar24 = (int)max_c - (int)min_c;
                pcVar13 = "bad range";
                if (((int)uVar24 < 0x1a) && (pcVar13 = "bad range", uVar22 <= uVar24))
                goto LAB_0011c2f9;
              }
            }
LAB_0011c27f:
            glob_00->error = pcVar13;
          }
          goto LAB_0011c28c;
        }
        *pbVar25 = 0;
        sVar4 = glob_00->size;
        pcVar13 = glob_00->glob_buffer;
        glob_00->pattern[sVar4].type = UPTSet;
        glob_00->pattern[sVar4].globindex = -1;
        glob_00->pattern[sVar4].content.NumRange.max_n = 1;
        ppcVar15 = (char **)malloc(8);
        glob_00->pattern[sVar4].content.Set.elements = ppcVar15;
        if (ppcVar15 == (char **)0x0) {
          glob_00->error = "out of memory";
          glob_00->pos = 0;
          local_284 = CURLE_OUT_OF_MEMORY;
        }
        else {
          __dest = (char *)malloc(sVar12 + 1);
          *ppcVar15 = __dest;
          if (__dest == (char *)0x0) {
            glob_00->error = "out of memory";
            glob_00->pos = 0;
            local_284 = CURLE_OUT_OF_MEMORY;
          }
          else {
            memcpy(__dest,pcVar13,sVar12);
            __dest[sVar12] = '\0';
            local_284 = CURLE_OK;
          }
        }
        goto LAB_0011c29c;
      }
      goto LAB_0011c429;
    }
    free(pcVar13);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_0011c175:
  pcVar13 = "unexpected close bracket";
LAB_0011c18f:
  glob_00->error = pcVar13;
LAB_0011c28c:
  glob_00->pos = (size_t)pbVar28;
LAB_0011c294:
  local_284 = CURLE_URL_MALFORMAT;
  pbVar23 = __s + 1;
LAB_0011c29c:
  uVar22 = glob_00->size + 1;
  glob_00->size = uVar22;
  bVar29 = true;
  pcVar13 = "too many globs";
  __s = pbVar23;
  local_278 = pbVar28;
  if (99 < uVar22) {
LAB_0011c2c1:
    glob_00->error = pcVar13;
    glob_00->pos = (size_t)local_278;
    bVar29 = false;
  }
  if (!bVar29) {
    local_284 = CURLE_URL_MALFORMAT;
LAB_0011c429:
    if (local_284 != CURLE_OK) {
      if ((local_258 != (FILE *)0x0) && (pcVar13 = glob_00->error, pcVar13 != (char *)0x0)) {
        sVar4 = glob_00->pos;
        if (sVar4 != 0) {
          curl_msnprintf(hostname,0x200,"%s in URL position %zu:\n%s\n%*s^",pcVar13,sVar4,local_248,
                         (int)sVar4 + -1," ");
          pcVar13 = hostname;
        }
        curl_mfprintf(local_258,"curl: (%d) %s\n",local_284,pcVar13);
      }
      glob_cleanup(glob_00);
      *local_250 = 1;
      return local_284;
    }
    *local_250 = local_268;
    *local_240 = glob_00;
    return CURLE_OK;
  }
  goto LAB_0011ba41;
}

Assistant:

CURLcode glob_url(struct URLGlob **glob, char *url, unsigned long *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  struct URLGlob *glob_expand;
  unsigned long amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0] = 0;

  glob_expand = calloc(1, sizeof(struct URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[512];
      const char *t;
      if(glob_expand->pos) {
        msnprintf(text, sizeof(text), "%s in URL position %zu:\n%s\n%*s^",
                  glob_expand->error,
                  glob_expand->pos, url, (int)glob_expand->pos - 1, " ");
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}